

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::pack_snorm_4x8
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  bool bVar1;
  char *__s;
  long *plVar2;
  size_type *psVar3;
  DataType in_R9D;
  long lVar4;
  string shaderSource;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  string local_78;
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"packSnorm4x8: Invalid v type.","");
  NegativeTestContext::beginSection(ctx,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  lVar4 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar4];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_b9);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1cbc003);
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_e0.field_2._M_allocated_capacity = *psVar3;
        local_e0.field_2._8_8_ = plVar2[3];
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar3;
        local_e0._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_e0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      local_58 = lVar4;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar4 = 0;
      do {
        if (lVar4 != 0xc) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourcePackUnpackNorm4x8_abi_cxx11_
                    (&local_e0,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                     ,0xb,*(ShaderFunction *)
                           ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes
                           + lVar4),in_R9D);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,local_e0._M_dataplus._M_p,
                     local_e0._M_dataplus._M_p + local_e0._M_string_length);
          verifyShader(ctx,shaderType,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
        }
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      lVar4 = 0;
      do {
        NegativeTestShared::(anonymous_namespace)::genShaderSourcePackUnpackNorm4x8_abi_cxx11_
                  (&local_e0,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   0xb,*(ShaderFunction *)
                        ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes +
                        lVar4),in_R9D);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_e0._M_dataplus._M_p,
                   local_e0._M_dataplus._M_p + local_e0._M_string_length);
        verifyShader(ctx,shaderType,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourcePackUnpackNorm4x8_abi_cxx11_
                  (&local_e0,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   0xb,*(ShaderFunction *)
                        ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes +
                        lVar4),in_R9D);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_e0._M_dataplus._M_p,
                   local_e0._M_dataplus._M_p + local_e0._M_string_length);
        verifyShader(ctx,shaderType,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      NegativeTestContext::endSection(ctx);
      lVar4 = local_58;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void pack_snorm_4x8 (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));

	ctx.beginSection("packSnorm4x8: Invalid v type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				if (s_floatTypes[dataTypeNdx] == glu::TYPE_FLOAT_VEC4)
					continue;

				const std::string shaderSource(genShaderSourcePackUnpackNorm4x8(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_PACK_SNORM_4X8, s_floatTypes[dataTypeNdx]));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourcePackUnpackNorm4x8(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_PACK_SNORM_4X8, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourcePackUnpackNorm4x8(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_PACK_SNORM_4X8, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}